

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::ElemStack::reset(ElemStack *this,uint emptyId,uint unknownId,uint xmlId,uint xmlNSId)

{
  uint uVar1;
  PrefMapElem *p;
  uint xmlNSId_local;
  uint xmlId_local;
  uint unknownId_local;
  uint emptyId_local;
  ElemStack *this_local;
  
  if (this->fGlobalNamespaces != (StackElem *)0x0) {
    p = this->fGlobalNamespaces->fMap;
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
    if (this->fGlobalNamespaces != (StackElem *)0x0) {
      XMemory::operator_delete((XMemory *)this->fGlobalNamespaces,p);
    }
    this->fGlobalNamespaces = (StackElem *)0x0;
  }
  this->fStackTop = 0;
  if (this->fXMLPoolId == 0) {
    uVar1 = XMLStringPool::addOrFind(&this->fPrefixPool,L"");
    this->fGlobalPoolId = uVar1;
    uVar1 = XMLStringPool::addOrFind(&this->fPrefixPool,L"xml");
    this->fXMLPoolId = uVar1;
    uVar1 = XMLStringPool::addOrFind(&this->fPrefixPool,(XMLCh *)XMLUni::fgXMLNSString);
    this->fXMLNSPoolId = uVar1;
  }
  this->fEmptyNamespaceId = emptyId;
  this->fUnknownNamespaceId = unknownId;
  this->fXMLNamespaceId = xmlId;
  this->fXMLNSNamespaceId = xmlNSId;
  return;
}

Assistant:

void ElemStack::reset(  const   unsigned int    emptyId
                        , const unsigned int    unknownId
                        , const unsigned int    xmlId
                        , const unsigned int    xmlNSId)
{
    if(fGlobalNamespaces)
    {
        fMemoryManager->deallocate(fGlobalNamespaces->fMap);
        delete fGlobalNamespaces;
        fGlobalNamespaces = 0;
    }

    // Reset the stack top to clear the stack
    fStackTop = 0;

    // if first time, put in the standard prefixes
    if (fXMLPoolId == 0) {

        fGlobalPoolId = fPrefixPool.addOrFind(XMLUni::fgZeroLenString);
        fXMLPoolId = fPrefixPool.addOrFind(XMLUni::fgXMLString);
        fXMLNSPoolId = fPrefixPool.addOrFind(XMLUni::fgXMLNSString);
    }

    // And store the new special URI ids
    fEmptyNamespaceId = emptyId;
    fUnknownNamespaceId = unknownId;
    fXMLNamespaceId = xmlId;
    fXMLNSNamespaceId = xmlNSId;
}